

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ninx::parser::element::NoopStatement,_std::default_delete<ninx::parser::element::NoopStatement>_>
 __thiscall ninx::parser::Parser::parse_operator_definition(Parser *this)

{
  bool bVar1;
  int iVar2;
  ParserException *pPVar3;
  type pbVar4;
  Token *pTVar5;
  mapped_type *this_00;
  Parser *in_RSI;
  Limiter *local_1a8;
  char local_f2;
  allocator local_f1;
  undefined1 local_f0 [6];
  char limiter;
  string local_d0 [8];
  string id;
  string local_a8;
  undefined1 local_88 [8];
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  id_ptr;
  string local_78;
  undefined1 local_55;
  allocator local_41;
  string local_40;
  Token *local_20;
  Token *id_token;
  Parser *this_local;
  
  this_local = this;
  local_20 = TokenReader::get_token(&in_RSI->reader);
  if (local_20 == (Token *)0x0) {
    local_55 = 1;
    pPVar3 = (ParserException *)__cxa_allocate_exception(0x20);
    pTVar5 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"Expected alias target, but could not find one.",&local_41);
    exception::ParserException::ParserException(pPVar3,pTVar5,&in_RSI->origin,&local_40);
    local_55 = 0;
    __cxa_throw(pPVar3,&exception::ParserException::typeinfo,
                exception::ParserException::~ParserException);
  }
  iVar2 = (*local_20->_vptr_Token[2])();
  if (iVar2 == 0) {
    if (local_20 != (Token *)0x0) {
      __dynamic_cast(local_20,&lexer::token::Token::typeinfo,&lexer::token::Text::typeinfo,0);
    }
    lexer::token::Text::get_identifier_abi_cxx11_((Text *)local_88);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_88);
    if (bVar1) {
      pbVar4 = std::
               unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_88);
      std::__cxx11::string::string(local_d0,(string *)pbVar4);
      iVar2 = TokenReader::check_type(&in_RSI->reader,LIMITER);
      if (iVar2 != 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_f0,"Expected operator, but could not find one.",&local_f1);
        generate_exception(in_RSI,(string *)local_f0);
        std::__cxx11::string::~string((string *)local_f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      }
      pTVar5 = TokenReader::get_token(&in_RSI->reader);
      if (pTVar5 == (Token *)0x0) {
        local_1a8 = (Limiter *)0x0;
      }
      else {
        local_1a8 = (Limiter *)
                    __dynamic_cast(pTVar5,&lexer::token::Token::typeinfo,
                                   &lexer::token::Limiter::typeinfo,0);
      }
      local_f2 = lexer::token::Limiter::get_limiter(local_1a8);
      this_00 = std::
                unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&in_RSI->operators,&local_f2);
      std::__cxx11::string::operator=((string *)this_00,local_d0);
      std::make_unique<ninx::parser::element::NoopStatement>();
      std::__cxx11::string::~string(local_d0);
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_88);
      return (__uniq_ptr_data<ninx::parser::element::NoopStatement,_std::default_delete<ninx::parser::element::NoopStatement>,_true,_true>
              )(__uniq_ptr_data<ninx::parser::element::NoopStatement,_std::default_delete<ninx::parser::element::NoopStatement>,_true,_true>
                )this;
    }
    id.field_2._M_local_buf[0xe] = '\x01';
    pPVar3 = (ParserException *)__cxa_allocate_exception(0x20);
    pTVar5 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_a8,
               "Invalid function name. It must be alphanumeric, and begin with a letter.",
               (allocator *)(id.field_2._M_local_buf + 0xf));
    exception::ParserException::ParserException(pPVar3,pTVar5,&in_RSI->origin,&local_a8);
    id.field_2._M_local_buf[0xe] = '\0';
    __cxa_throw(pPVar3,&exception::ParserException::typeinfo,
                exception::ParserException::~ParserException);
  }
  id_ptr._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._6_1_ = 1;
  pPVar3 = (ParserException *)__cxa_allocate_exception(0x20);
  pTVar5 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_78,"Alias target name must be alphanumeric, and begin with a letter.",
             (allocator *)
             ((long)&id_ptr._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 7));
  exception::ParserException::ParserException(pPVar3,pTVar5,&in_RSI->origin,&local_78);
  id_ptr._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._6_1_ = 0;
  __cxa_throw(pPVar3,&exception::ParserException::typeinfo,
              exception::ParserException::~ParserException);
}

Assistant:

std::unique_ptr<NoopStatement> ninx::parser::Parser::parse_operator_definition() {
    // Extract the alias identifier
    auto id_token{reader.get_token()};
    if (!id_token) {
        throw ParserException(id_token, this->origin, "Expected alias target, but could not find one.");
    }
    if (id_token->get_type() != Type::TEXT) {
        throw ParserException(id_token, this->origin, "Alias target name must be alphanumeric, and begin with a letter.");
    }
    auto id_ptr{dynamic_cast<ninx::lexer::token::Text *>(id_token)->get_identifier()};
    if (!id_ptr) {
        throw ParserException(id_token, this->origin,
                              "Invalid function name. It must be alphanumeric, and begin with a letter.");
    }
    std::string id{*id_ptr};

    // Extract the operator limiter
    if (reader.check_type(Type::LIMITER) != 1) {
        generate_exception("Expected operator, but could not find one.");
    }

    char limiter {dynamic_cast<ninx::lexer::token::Limiter*>(reader.get_token())->get_limiter()};

    // Register the limiter in the operator table
    operators[limiter] = id;

    return std::make_unique<NoopStatement>();
}